

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

int SSL_CTX_use_RSAPrivateKey(SSL_CTX *ctx,RSA *rsa)

{
  bool bVar1;
  int iVar2;
  EVP_PKEY *pEVar3;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_28;
  UniquePtr<EVP_PKEY> pkey;
  RSA *rsa_local;
  SSL_CTX *ctx_local;
  
  pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)rsa;
  if (rsa == (RSA *)0x0) {
    ERR_put_error(0x10,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x17c);
    return 0;
  }
  pEVar3 = EVP_PKEY_new();
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_28,(pointer)pEVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (bVar1) {
    pEVar3 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_28);
    iVar2 = EVP_PKEY_set1_RSA(pEVar3,(rsa_st *)
                                     pkey._M_t.
                                     super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
    if (iVar2 != 0) {
      pEVar3 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_28);
      ctx_local._4_4_ = SSL_CTX_use_PrivateKey(ctx,pEVar3);
      goto LAB_001b82e9;
    }
  }
  ERR_put_error(0x10,0,6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                ,0x182);
  ctx_local._4_4_ = 0;
LAB_001b82e9:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return ctx_local._4_4_;
}

Assistant:

int SSL_CTX_use_RSAPrivateKey(SSL_CTX *ctx, RSA *rsa) {
  if (rsa == NULL) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  UniquePtr<EVP_PKEY> pkey(EVP_PKEY_new());
  if (!pkey || !EVP_PKEY_set1_RSA(pkey.get(), rsa)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_EVP_LIB);
    return 0;
  }

  return SSL_CTX_use_PrivateKey(ctx, pkey.get());
}